

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

optional<Vault::AuthenticationResponse> * __thiscall
SuccessfulAuth::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,SuccessfulAuth *this,
          Client *client)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  uint *local_a0;
  size_type local_98;
  uint local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  uint *local_80;
  size_type local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  size_type *local_60;
  undefined8 local_58;
  size_type local_50;
  undefined8 uStack_48;
  size_type *local_40;
  size_type local_38;
  undefined1 local_30;
  uint7 uStack_2f;
  undefined8 uStack_28;
  
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  if (local_a0 == &local_90) {
    uStack_68 = uStack_88;
    uStack_64 = uStack_84;
    local_80 = (uint *)&local_70;
  }
  else {
    local_80 = local_a0;
  }
  local_70 = CONCAT44(uStack_8c,local_90);
  local_78 = local_98;
  local_98 = 0;
  local_90 = local_90 & 0xffffff00;
  local_a0 = &local_90;
  local_40 = (size_type *)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"success","");
  sVar2 = local_38;
  local_60 = &local_50;
  if (local_40 == (size_type *)&local_30) {
    uStack_48 = uStack_28;
    local_40 = local_60;
  }
  local_50 = CONCAT71(uStack_2f,local_30);
  local_38 = 0;
  local_30 = 0;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                      super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload.
                      _M_value.rawResponse.value_ + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
        _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
        super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload = paVar1;
  if (local_80 == (uint *)&local_70) {
    paVar1->_M_allocated_capacity = local_70;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                      super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload.
                      _M_value.rawResponse.value_ + 0x18) = CONCAT44(uStack_64,uStack_68);
  }
  else {
    *(uint **)&(__return_storage_ptr__->
               super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
               super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
               super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
               rawResponse.value_ = local_80;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(__return_storage_ptr__->
                super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
                rawResponse.value_ + 0x10))->_M_allocated_capacity = local_70;
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
           super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
           super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
           rawResponse.value_ + 8) = local_78;
  local_78 = 0;
  local_70 = local_70 & 0xffffffffffffff00;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                      super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload.
                      _M_value.token.value_ + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&(__return_storage_ptr__->
               super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
               super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
               super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload + 0x20) =
       paVar1;
  if (local_40 == local_60) {
    paVar1->_M_allocated_capacity = local_50;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
             super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
             super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.
             value_ + 0x18) = uStack_48;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
    _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
    super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.value_.
    _M_dataplus = (_Alloc_hider)local_40;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(__return_storage_ptr__->
                super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
                token.value_ + 0x10))->_M_allocated_capacity = local_50;
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
           super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
           super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.
           value_ + 8) = sVar2;
  local_58 = 0;
  local_50 = (ulong)uStack_2f << 8;
  (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
  _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
  super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged = true;
  if (local_a0 != &local_90) {
    local_80 = (uint *)&local_70;
    local_40 = (size_type *)&local_30;
    operator_delete(local_a0,CONCAT44(uStack_8c,local_90) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
  authenticate(const Vault::Client &client) override {
    return std::optional<Vault::AuthenticationResponse>(
        {Vault::HttpResponseBodyString{""}, Vault::Token{"success"}});
  }